

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void print_option_string(nh_option_desc *option,char *buf)

{
  char *pcVar1;
  size_t sVar2;
  char *valstr;
  char *opttxt;
  char fmt [16];
  char *buf_local;
  nh_option_desc *option_local;
  
  fmt._8_8_ = buf;
  pcVar1 = get_display_string(option);
  if (settings.optstyle == 0) {
    valstr = option->helptxt;
    if ((valstr == (char *)0x0) || (sVar2 = strlen(valstr), sVar2 < 2)) {
      valstr = option->name;
    }
    sprintf((char *)&opttxt,"%%.%ds\t[%%s]",(ulong)(_COLS - 0x15));
    snprintf((char *)fmt._8_8_,0x100,(char *)&opttxt,valstr,pcVar1);
  }
  else if (settings.optstyle == 1) {
    sprintf((char *)&opttxt,"%%.%ds\t[%%s]",(ulong)(_COLS - 0x15));
    snprintf((char *)fmt._8_8_,0x100,(char *)&opttxt,option->name,pcVar1);
  }
  else {
    sprintf((char *)&opttxt,"%%s\t[%%s]\t%%.%ds",(ulong)(_COLS - 0x2a));
    snprintf((char *)fmt._8_8_,0x100,(char *)&opttxt,option->name,pcVar1,option->helptxt);
  }
  return;
}

Assistant:

static void print_option_string(struct nh_option_desc *option, char *buf)
{
    char fmt[16];
    const char *opttxt;
    const char *valstr = get_display_string(option);
    
    switch (settings.optstyle) {
	case OPTSTYLE_DESC:
	    opttxt = option->helptxt;
	    if (!opttxt || strlen(opttxt) < 2)
		opttxt = option->name;
	    
	    sprintf(fmt, "%%.%ds\t[%%s]", COLS - 21);
	    snprintf(buf, BUFSZ, fmt, opttxt, valstr);
	    break;
	    
	case OPTSTYLE_NAME:
	    sprintf(fmt, "%%.%ds\t[%%s]", COLS - 21);
	    snprintf(buf, BUFSZ, fmt, option->name, valstr);
	    break;
	    
	default:
	case OPTSTYLE_FULL:
	    sprintf(fmt, "%%s\t[%%s]\t%%.%ds", COLS - 42);
	    snprintf(buf, BUFSZ, fmt, option->name, valstr, option->helptxt);
	    break;
    }
}